

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

bool amrex::Amr::isStateSmallPlotVar(string *name)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  int iVar2;
  undefined8 *puVar3;
  bool bVar4;
  
  bVar4 = (undefined8 **)state_small_plot_vars_abi_cxx11_ != &state_small_plot_vars_abi_cxx11_;
  if (bVar4) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar1 = name->_M_string_length;
    puVar3 = state_small_plot_vars_abi_cxx11_;
    do {
      __n = puVar3[3];
      if (__n == sVar1) {
        if (__n == 0) {
          return bVar4;
        }
        iVar2 = bcmp((void *)puVar3[2],__s2,__n);
        if (iVar2 == 0) {
          return bVar4;
        }
      }
      puVar3 = (undefined8 *)*puVar3;
      bVar4 = (undefined8 **)puVar3 != &state_small_plot_vars_abi_cxx11_;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool
Amr::isStateSmallPlotVar (const std::string& name)
{
    for (std::list<std::string>::const_iterator li = state_small_plot_vars.begin(), End = state_small_plot_vars.end();
         li != End;
         ++li)
    {
        if (*li == name)
            return true;
    }
    return false;
}